

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

bool loadEnvmapTexture(void)

{
  char *filename;
  bool bVar1;
  GLboolean GVar2;
  GLenum GVar3;
  reference ppcVar4;
  djg_texture *texture;
  GLuint *glt;
  djg_texture *djgt;
  char *path;
  int id;
  
  fprintf(_stdout,"Loading {Envmap-Texture}\n");
  fflush(_stdout);
  bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    (&g_sphere.shading.envmap.files);
  if (!bVar1) {
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&g_sphere.shading.envmap.files,(long)g_sphere.shading.envmap.id);
    filename = *ppcVar4;
    GVar2 = (*glad_glIsTexture)(g_gl.textures[3]);
    if (GVar2 != '\0') {
      (*glad_glDeleteTextures)(1,g_gl.textures + 3);
    }
    (*glad_glGenTextures)(1,g_gl.textures + 3);
    texture = djgt_create(0);
    (*glad_glActiveTexture)(0x84c3);
    djgt_push_image_hdr(texture,filename,true);
    bVar1 = djgt_to_gl(texture,0xde1,0x8c3d,true,true,g_gl.textures + 3);
    if (!bVar1) {
      fprintf(_stdout,"=> Failure <=\n");
      fflush(_stdout);
      djgt_release(texture);
      return false;
    }
    (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glActiveTexture)(0x84c0);
    djgt_release(texture);
  }
  GVar3 = (*glad_glGetError)();
  return GVar3 == 0;
}

Assistant:

bool loadEnvmapTexture()
{
    LOG("Loading {Envmap-Texture}\n");
    if (!g_sphere.shading.envmap.files.empty()) {
        int id = g_sphere.shading.envmap.id;
        const char *path = g_sphere.shading.envmap.files[id];

        if (glIsTexture(g_gl.textures[TEXTURE_ENVMAP]))
            glDeleteTextures(1, &g_gl.textures[TEXTURE_ENVMAP]);
        glGenTextures(1, &g_gl.textures[TEXTURE_ENVMAP]);

        djg_texture *djgt = djgt_create(0);
        GLuint *glt = &g_gl.textures[TEXTURE_ENVMAP];

        glActiveTexture(GL_TEXTURE0 + TEXTURE_ENVMAP);
        djgt_push_image_hdr(djgt, path, 1);

        if (!djgt_to_gl(djgt, GL_TEXTURE_2D, GL_RGB9_E5, 1, 1, glt)) {
            LOG("=> Failure <=\n");
            djgt_release(djgt);

            return false;
        }
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
        glActiveTexture(GL_TEXTURE0);

        djgt_release(djgt);
    }
    return (glGetError() == GL_NO_ERROR);
}